

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SEES_PDU.cpp
# Opt level: O1

void __thiscall KDIS::PDU::SEES_PDU::Decode(SEES_PDU *this,KDataStream *stream,bool ignoreHeader)

{
  KUINT16 *pKVar1;
  pointer pPVar2;
  pointer pPVar3;
  pointer pVVar4;
  pointer pVVar5;
  KUINT16 KVar6;
  KException *this_00;
  int iVar7;
  undefined7 in_register_00000011;
  pointer pPVar8;
  pointer pVVar9;
  ushort uVar10;
  PropulsionSystem ps;
  KString local_58;
  KUINT16 *local_38;
  
  KVar6 = KDataStream::GetBufferSize(stream);
  iVar7 = 0xc;
  if ((int)CONCAT71(in_register_00000011,ignoreHeader) == 0) {
    iVar7 = 0;
  }
  if (iVar7 + (uint)KVar6 < 0x1c) {
    this_00 = (KException *)__cxa_allocate_exception(0x30);
    local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"Decode","");
    KException::KException(this_00,&local_58,2);
    __cxa_throw(this_00,&KException::typeinfo,KException::~KException);
  }
  Header7::Decode(&this->super_Header,stream,ignoreHeader);
  (*(this->m_OriginatingEntity).super_SimulationIdentifier.super_DataTypeBase._vptr_DataTypeBase[3])
            (&this->m_OriginatingEntity,stream);
  KDataStream::Read<unsigned_short>(stream,&this->m_ui16IrSigRepIndex);
  KDataStream::Read<unsigned_short>(stream,&this->m_ui16AcousticSigRepIndex);
  KDataStream::Read<unsigned_short>(stream,&this->m_ui16CrossSection);
  pKVar1 = &this->m_ui16NumPropulsionSys;
  KDataStream::Read<unsigned_short>(stream,pKVar1);
  local_38 = &this->m_ui16NumVectoringNozzleSys;
  KDataStream::Read<unsigned_short>(stream,local_38);
  pPVar2 = (this->m_vPropSys).
           super__Vector_base<KDIS::DATA_TYPE::PropulsionSystem,_std::allocator<KDIS::DATA_TYPE::PropulsionSystem>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pPVar3 = (this->m_vPropSys).
           super__Vector_base<KDIS::DATA_TYPE::PropulsionSystem,_std::allocator<KDIS::DATA_TYPE::PropulsionSystem>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pPVar8 = pPVar2;
  if (pPVar3 != pPVar2) {
    do {
      (**(pPVar8->super_DataTypeBase)._vptr_DataTypeBase)(pPVar8);
      pPVar8 = pPVar8 + 1;
    } while (pPVar8 != pPVar3);
    (this->m_vPropSys).
    super__Vector_base<KDIS::DATA_TYPE::PropulsionSystem,_std::allocator<KDIS::DATA_TYPE::PropulsionSystem>_>
    ._M_impl.super__Vector_impl_data._M_finish = pPVar2;
  }
  pVVar4 = (this->m_vVecNozzleSys).
           super__Vector_base<KDIS::DATA_TYPE::VectoringNozzleSystem,_std::allocator<KDIS::DATA_TYPE::VectoringNozzleSystem>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pVVar5 = (this->m_vVecNozzleSys).
           super__Vector_base<KDIS::DATA_TYPE::VectoringNozzleSystem,_std::allocator<KDIS::DATA_TYPE::VectoringNozzleSystem>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pVVar9 = pVVar4;
  if (pVVar5 != pVVar4) {
    do {
      (**(pVVar9->super_DataTypeBase)._vptr_DataTypeBase)(pVVar9);
      pVVar9 = pVVar9 + 1;
    } while (pVVar9 != pVVar5);
    (this->m_vVecNozzleSys).
    super__Vector_base<KDIS::DATA_TYPE::VectoringNozzleSystem,_std::allocator<KDIS::DATA_TYPE::VectoringNozzleSystem>_>
    ._M_impl.super__Vector_impl_data._M_finish = pVVar4;
  }
  if (*pKVar1 != 0) {
    uVar10 = 0;
    do {
      DATA_TYPE::PropulsionSystem::PropulsionSystem((PropulsionSystem *)&local_58);
      (**(code **)(local_58._M_dataplus._M_p + 0x18))(&local_58,stream);
      std::
      vector<KDIS::DATA_TYPE::PropulsionSystem,_std::allocator<KDIS::DATA_TYPE::PropulsionSystem>_>
      ::push_back(&this->m_vPropSys,(value_type *)&local_58);
      DATA_TYPE::PropulsionSystem::~PropulsionSystem((PropulsionSystem *)&local_58);
      uVar10 = uVar10 + 1;
    } while (uVar10 < *pKVar1);
  }
  pKVar1 = local_38;
  if (*local_38 != 0) {
    uVar10 = 0;
    do {
      DATA_TYPE::VectoringNozzleSystem::VectoringNozzleSystem((VectoringNozzleSystem *)&local_58);
      (**(code **)(local_58._M_dataplus._M_p + 0x18))(&local_58,stream);
      std::
      vector<KDIS::DATA_TYPE::VectoringNozzleSystem,_std::allocator<KDIS::DATA_TYPE::VectoringNozzleSystem>_>
      ::push_back(&this->m_vVecNozzleSys,(value_type *)&local_58);
      DATA_TYPE::VectoringNozzleSystem::~VectoringNozzleSystem((VectoringNozzleSystem *)&local_58);
      uVar10 = uVar10 + 1;
    } while (uVar10 < *pKVar1);
  }
  return;
}

Assistant:

void SEES_PDU::Decode(KDataStream &stream, bool ignoreHeader /*= true*/ ) noexcept(false)
{
    if( ( stream.GetBufferSize() + ( ignoreHeader ? Header::HEADER6_PDU_SIZE : 0 ) ) < SEES_PDU_SIZE )throw KException( __FUNCTION__, NOT_ENOUGH_DATA_IN_BUFFER );

    Header::Decode( stream, ignoreHeader );

    stream >> KDIS_STREAM m_OriginatingEntity
           >> m_ui16IrSigRepIndex
           >> m_ui16AcousticSigRepIndex
           >> m_ui16CrossSection
           >> m_ui16NumPropulsionSys
           >> m_ui16NumVectoringNozzleSys;

    m_vPropSys.clear();
    m_vVecNozzleSys.clear();

    for( KUINT16 i = 0; i < m_ui16NumPropulsionSys; ++i )
    {
        PropulsionSystem ps;
        stream >> KDIS_STREAM ps;
        m_vPropSys.push_back( ps );
    }

    for( KUINT16 i = 0; i < m_ui16NumVectoringNozzleSys; ++i )
    {
        VectoringNozzleSystem vns;
        stream >> KDIS_STREAM vns;
        m_vVecNozzleSys.push_back( vns );
    }
}